

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnode.c
# Opt level: O0

int lnode_create_arg_table(lua_State *L,char **argv,int argc,int script)

{
  int local_24;
  int narg;
  int i;
  int script_local;
  int argc_local;
  char **argv_local;
  lua_State *L_local;
  
  narg = script;
  if (script == argc) {
    narg = 0;
  }
  lua_createtable(L,argc - (narg + 1),narg + 1);
  for (local_24 = 0; local_24 < argc; local_24 = local_24 + 1) {
    lua_pushstring(L,argv[local_24]);
    lua_rawseti(L,-2,(long)(local_24 - narg));
  }
  lua_setglobal(L,"arg");
  return 0;
}

Assistant:

LUALIB_API int lnode_create_arg_table(lua_State *L, char **argv, int argc, int script)
{
    int i, narg;

    if (script == argc) {
        script = 0; /* no script name? */
    }

    narg = argc - (script + 1); /* number of positive indices */

    lua_createtable(L, narg, script + 1);
    for (i = 0; i < argc; i++) {
        lua_pushstring(L, argv[i]);
        lua_rawseti(L, -2, i - script);
    }
    lua_setglobal(L, "arg");

    return 0;
}